

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int find_lexical_decl(JSContext *ctx,JSFunctionDef *fd,JSAtom name,int scope_idx,
                     BOOL check_catch_var)

{
  JSGlobalVar *pJVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  JSVarDef *vd;
  int *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int local_20;
  int local_4;
  
  local_20 = in_ECX;
  while( true ) {
    if (local_20 < 0) {
      if (((*(int *)(in_RSI + 0x38) == 0) || (*(int *)(in_RSI + 0x3c) != 0)) ||
         (pJVar1 = find_lexical_global_var
                             ((JSFunctionDef *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                              (JSAtom)((ulong)in_stack_ffffffffffffffd0 >> 0x20)),
         pJVar1 == (JSGlobalVar *)0x0)) {
        local_4 = -1;
      }
      else {
        local_4 = 0x40000000;
      }
      return local_4;
    }
    in_stack_ffffffffffffffd0 = (int *)(*(long *)(in_RSI + 0x90) + (long)local_20 * 0x10);
    if ((*in_stack_ffffffffffffffd0 == in_EDX) &&
       ((((uint)in_stack_ffffffffffffffd0[3] >> 1 & 1) != 0 ||
        ((((uint)in_stack_ffffffffffffffd0[3] >> 3 & 0xf) == 3 && (in_R8D != 0)))))) break;
    local_20 = in_stack_ffffffffffffffd0[2];
  }
  return local_20;
}

Assistant:

static int find_lexical_decl(JSContext *ctx, JSFunctionDef *fd, JSAtom name,
                             int scope_idx, BOOL check_catch_var)
{
    while (scope_idx >= 0) {
        JSVarDef *vd = &fd->vars[scope_idx];
        if (vd->var_name == name &&
            (vd->is_lexical || (vd->var_kind == JS_VAR_CATCH &&
                                check_catch_var)))
            return scope_idx;
        scope_idx = vd->scope_next;
    }

    if (fd->is_eval && fd->eval_type == JS_EVAL_TYPE_GLOBAL) {
        if (find_lexical_global_var(fd, name))
            return GLOBAL_VAR_OFFSET;
    }
    return -1;
}